

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.h
# Opt level: O0

int sat_solver2_add_buffer(sat_solver2 *pSat,int iVarA,int iVarB,int fCompl,int fMark,int Id)

{
  int iVar1;
  lit local_2c;
  int Cid;
  lit Lits [2];
  int Id_local;
  int fMark_local;
  int fCompl_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver2 *pSat_local;
  
  Lits[0] = Id;
  Lits[1] = fMark;
  if ((-1 < iVarA) && (-1 < iVarB)) {
    local_2c = toLitCond(iVarA,0);
    Cid = toLitCond(iVarB,(uint)((fCompl != 0 ^ 0xffU) & 1));
    iVar1 = sat_solver2_addclause(pSat,&local_2c,Lits,Lits[0]);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    local_2c = toLitCond(iVarA,1);
    Cid = toLitCond(iVarB,fCompl);
    iVar1 = sat_solver2_addclause(pSat,&local_2c,Lits,Lits[0]);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    return 2;
  }
  __assert_fail("iVarA >= 0 && iVarB >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.h"
                ,0x117,"int sat_solver2_add_buffer(sat_solver2 *, int, int, int, int, int)");
}

Assistant:

static inline int sat_solver2_add_buffer( sat_solver2 * pSat, int iVarA, int iVarB, int fCompl, int fMark, int Id )
{
    lit Lits[2];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 );

    Lits[0] = toLitCond( iVarA, 0 );
    Lits[1] = toLitCond( iVarB, !fCompl );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 2, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );

    Lits[0] = toLitCond( iVarA, 1 );
    Lits[1] = toLitCond( iVarB, fCompl );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 2, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );
    return 2;
}